

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_static_histogram<long>::basic_static_histogram
          (basic_static_histogram<long> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,size_t dupli_count)

{
  pointer pdVar1;
  size_t dupli_count_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string(&local_48,name);
  std::__cxx11::string::string(&local_68,help);
  static_metric::metric_t(&this->super_static_metric,Histogram,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_static_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_static_histogram_001e8080;
  pdVar1 = (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<ylt::metric::basic_static_gauge<long>,char_const(&)[1],char_const(&)[1],unsigned_long&>
            ((char (*) [1])&this->sum_,(char (*) [1])0x1857ad,(unsigned_long *)0x1857ad);
  init_bucket_counter(this,dupli_count,
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

basic_static_histogram(std::string name, std::string help,
                         std::vector<double> buckets, size_t dupli_count = 2)
      : bucket_boundaries_(std::move(buckets)),
        static_metric(MetricType::Histogram, std::move(name), std::move(help)),
        sum_(std::make_shared<gauge_t>("", "", dupli_count)) {
    init_bucket_counter(dupli_count, bucket_boundaries_.size());
  }